

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

Component __thiscall ftxui::ComponentBase::ActiveChild(ComponentBase *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  Component CVar1;
  
  if (*(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 8) ==
      *(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10)) {
    this->_vptr_ComponentBase = (_func_int **)0x0;
    (this->children_).
    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)this,
               *(__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 8));
    in_RDX._M_pi = extraout_RDX;
  }
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component ComponentBase::ActiveChild() {
  return children_.empty() ? nullptr : children_.front();
}